

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::post_peer_info(torrent *this)

{
  alert_manager *this_00;
  undefined1 local_48 [40];
  vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> v;
  torrent *this_local;
  
  v.super__Vector_base<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ::std::vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>::vector
            ((vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *)
             (local_48 + 0x20));
  get_peer_info(this,(vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>
                      *)(local_48 + 0x20));
  this_00 = alerts(this);
  get_handle((torrent *)local_48);
  alert_manager::
  emplace_alert<libtorrent::peer_info_alert,libtorrent::torrent_handle,std::vector<libtorrent::v1_2::peer_info,std::allocator<libtorrent::v1_2::peer_info>>>
            (this_00,(torrent_handle *)local_48,
             (vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *)
             (local_48 + 0x20));
  torrent_handle::~torrent_handle((torrent_handle *)local_48);
  ::std::vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_>::~vector
            ((vector<libtorrent::v1_2::peer_info,_std::allocator<libtorrent::v1_2::peer_info>_> *)
             (local_48 + 0x20));
  return;
}

Assistant:

void torrent::post_peer_info()
	{
		std::vector<peer_info> v;
		get_peer_info(&v);
		alerts().emplace_alert<peer_info_alert>(get_handle(), std::move(v));
	}